

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::Mock::ClearDefaultActionsLocked(void *mock_obj)

{
  bool bVar1;
  StateMap *pSVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  reference ppUVar5;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  FunctionMockers *mockers;
  void *mock_obj_local;
  
  mockers = (FunctionMockers *)mock_obj;
  internal::MutexBase::AssertHeld((MutexBase *)internal::g_gmock_mutex);
  pSVar2 = anon_unknown_18::MockObjectRegistry::states
                     ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  sVar3 = std::
          map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
          ::count(pSVar2,&mockers);
  if (sVar3 != 0) {
    pSVar2 = anon_unknown_18::MockObjectRegistry::states
                       ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
    pmVar4 = std::
             map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
             ::operator[](pSVar2,&mockers);
    it._M_node = (_Base_ptr)&pmVar4->function_mockers;
    local_20._M_node =
         (_Base_ptr)
         std::
         set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
         ::begin((set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
                  *)it._M_node);
    while( true ) {
      local_28._M_node =
           (_Base_ptr)
           std::
           set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
           ::end(it._M_node);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      ppUVar5 = std::_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*>::
                operator*(&local_20);
      (**(code **)(*(long *)*ppUVar5 + 0x18))();
      std::_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*>::operator++
                (&local_20);
    }
  }
  return;
}

Assistant:

void Mock::ClearDefaultActionsLocked(void* mock_obj) {
  internal::g_gmock_mutex.AssertHeld();

  if (g_mock_object_registry.states().count(mock_obj) == 0) {
    // No ON_CALL() was set on the given mock object.
    return;
  }

  // Clears the default actions for each mock method in the given mock
  // object.
  FunctionMockers& mockers =
      g_mock_object_registry.states()[mock_obj].function_mockers;
  for (FunctionMockers::const_iterator it = mockers.begin();
       it != mockers.end(); ++it) {
    (*it)->ClearDefaultActionsLocked();
  }

  // We don't clear the content of mockers, as they may still be
  // needed by VerifyAndClearExpectationsLocked().
}